

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mxu_Q8MAX_Q8MIN(DisasContext_conflict4 *ctx)

{
  TCGContext_conflict4 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  TCGv_i32 pTVar5;
  TCGv_i32 pTVar6;
  uint32_t local_64;
  int local_5c;
  int32_t i_1;
  TCGv_i32 t1_1;
  TCGv_i32 t0_1;
  int32_t i;
  TCGv_i32 t1;
  TCGv_i32 t0;
  uint32_t XRx;
  uint32_t XRa;
  uint32_t XRb;
  uint32_t XRc;
  uint32_t opc;
  uint32_t pad;
  TCGContext_conflict4 *tcg_ctx;
  DisasContext_conflict4 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = extract32(ctx->opcode,0x15,5);
  uVar2 = extract32(ctx->opcode,0x12,3);
  local_64 = extract32(ctx->opcode,0xe,4);
  uVar3 = extract32(ctx->opcode,10,4);
  uVar4 = extract32(ctx->opcode,6,4);
  if ((uVar1 == 0) && (uVar4 != 0)) {
    if (uVar3 == 0 && local_64 == 0) {
      tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],0);
    }
    else if (uVar3 == 0 || local_64 == 0) {
      if (uVar3 != 0) {
        local_64 = uVar3;
      }
      pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
      pTVar6 = tcg_const_i32_mipsel(tcg_ctx_00,0);
      tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar5,tcg_ctx_00->mxu_gpr[local_64 - 1],-0x1000000);
      if (uVar2 == 4) {
        tcg_gen_smax_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],pTVar5,pTVar6);
      }
      else {
        tcg_gen_smin_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],pTVar5,pTVar6);
      }
      for (t0_1._4_4_ = 2; -1 < t0_1._4_4_; t0_1._4_4_ = t0_1._4_4_ + -1) {
        tcg_gen_andi_i32_mipsel
                  (tcg_ctx_00,pTVar5,tcg_ctx_00->mxu_gpr[local_64 - 1],
                   0xff << ((byte)(t0_1._4_4_ << 3) & 0x1f));
        tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar5,pTVar5,(3 - t0_1._4_4_) * 8);
        if (uVar2 == 4) {
          tcg_gen_smax_i32_mipsel(tcg_ctx_00,pTVar5,pTVar5,pTVar6);
        }
        else {
          tcg_gen_smin_i32_mipsel(tcg_ctx_00,pTVar5,pTVar5,pTVar6);
        }
        tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar5,pTVar5,(3 - t0_1._4_4_) * 8);
        tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],tcg_ctx_00->mxu_gpr[uVar4 - 1],
                       pTVar5);
      }
      tcg_temp_free_i32(tcg_ctx_00,pTVar6);
      tcg_temp_free_i32(tcg_ctx_00,pTVar5);
    }
    else if (uVar3 == local_64) {
      tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],tcg_ctx_00->mxu_gpr[uVar3 - 1]);
    }
    else {
      pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
      pTVar6 = tcg_temp_new_i32(tcg_ctx_00);
      tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar5,tcg_ctx_00->mxu_gpr[uVar3 - 1],-0x1000000);
      tcg_gen_andi_i32_mipsel(tcg_ctx_00,pTVar6,tcg_ctx_00->mxu_gpr[local_64 - 1],-0x1000000);
      if (uVar2 == 4) {
        tcg_gen_smax_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],pTVar5,pTVar6);
      }
      else {
        tcg_gen_smin_i32_mipsel(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],pTVar5,pTVar6);
      }
      for (local_5c = 2; -1 < local_5c; local_5c = local_5c + -1) {
        tcg_gen_andi_i32_mipsel
                  (tcg_ctx_00,pTVar5,tcg_ctx_00->mxu_gpr[uVar3 - 1],
                   0xff << ((byte)(local_5c << 3) & 0x1f));
        tcg_gen_andi_i32_mipsel
                  (tcg_ctx_00,pTVar6,tcg_ctx_00->mxu_gpr[local_64 - 1],
                   0xff << ((byte)(local_5c << 3) & 0x1f));
        tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar5,pTVar5,(3 - local_5c) * 8);
        tcg_gen_shli_i32_mipsel(tcg_ctx_00,pTVar6,pTVar6,(3 - local_5c) * 8);
        if (uVar2 == 4) {
          tcg_gen_smax_i32_mipsel(tcg_ctx_00,pTVar5,pTVar5,pTVar6);
        }
        else {
          tcg_gen_smin_i32_mipsel(tcg_ctx_00,pTVar5,pTVar5,pTVar6);
        }
        tcg_gen_shri_i32_mipsel(tcg_ctx_00,pTVar5,pTVar5,(3 - local_5c) * 8);
        tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],tcg_ctx_00->mxu_gpr[uVar4 - 1],
                       pTVar5);
      }
      tcg_temp_free_i32(tcg_ctx_00,pTVar6);
      tcg_temp_free_i32(tcg_ctx_00,pTVar5);
    }
  }
  return;
}

Assistant:

static void gen_mxu_Q8MAX_Q8MIN(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t pad, opc, XRc, XRb, XRa;

    pad = extract32(ctx->opcode, 21, 5);
    opc = extract32(ctx->opcode, 18, 3);
    XRc = extract32(ctx->opcode, 14, 4);
    XRb = extract32(ctx->opcode, 10, 4);
    XRa = extract32(ctx->opcode,  6, 4);

    if (unlikely(pad != 0)) {
        /* opcode padding incorrect -> do nothing */
    } else if (unlikely(XRa == 0)) {
        /* destination is zero register -> do nothing */
    } else if (unlikely((XRb == 0) && (XRc == 0))) {
        /* both operands zero registers -> just set destination to zero */
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], 0);
    } else if (unlikely((XRb == 0) || (XRc == 0))) {
        /* exactly one operand is zero register - make it be the first...*/
        uint32_t XRx = XRb ? XRb : XRc;
        /* ...and do byte-wise max/min with one operand 0 */
        TCGv_i32 t0 = tcg_temp_new(tcg_ctx);
        TCGv_i32 t1 = tcg_const_i32(tcg_ctx, 0);
        int32_t i;

        /* the leftmost byte (byte 3) first */
        tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->mxu_gpr[XRx - 1], 0xFF000000);
        if (opc == OPC_MXU_Q8MAX) {
            tcg_gen_smax_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], t0, t1);
        } else {
            tcg_gen_smin_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], t0, t1);
        }

        /* bytes 2, 1, 0 */
        for (i = 2; i >= 0; i--) {
            /* extract the byte */
            tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->mxu_gpr[XRx - 1], 0xFF << (8 * i));
            /* move the byte to the leftmost position */
            tcg_gen_shli_i32(tcg_ctx, t0, t0, 8 * (3 - i));
            /* t0 will be max/min of t0 and t1 */
            if (opc == OPC_MXU_Q8MAX) {
                tcg_gen_smax_i32(tcg_ctx, t0, t0, t1);
            } else {
                tcg_gen_smin_i32(tcg_ctx, t0, t0, t1);
            }
            /* return resulting byte to its original position */
            tcg_gen_shri_i32(tcg_ctx, t0, t0, 8 * (3 - i));
            /* finaly update the destination */
            tcg_gen_or_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], tcg_ctx->mxu_gpr[XRa - 1], t0);
        }

        tcg_temp_free(tcg_ctx, t1);
        tcg_temp_free(tcg_ctx, t0);
    } else if (unlikely(XRb == XRc)) {
        /* both operands same -> just set destination to one of them */
        tcg_gen_mov_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], tcg_ctx->mxu_gpr[XRb - 1]);
    } else {
        /* the most general case */
        TCGv_i32 t0 = tcg_temp_new(tcg_ctx);
        TCGv_i32 t1 = tcg_temp_new(tcg_ctx);
        int32_t i;

        /* the leftmost bytes (bytes 3) first */
        tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->mxu_gpr[XRb - 1], 0xFF000000);
        tcg_gen_andi_i32(tcg_ctx, t1, tcg_ctx->mxu_gpr[XRc - 1], 0xFF000000);
        if (opc == OPC_MXU_Q8MAX) {
            tcg_gen_smax_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], t0, t1);
        } else {
            tcg_gen_smin_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], t0, t1);
        }

        /* bytes 2, 1, 0 */
        for (i = 2; i >= 0; i--) {
            /* extract corresponding bytes */
            tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->mxu_gpr[XRb - 1], 0xFF << (8 * i));
            tcg_gen_andi_i32(tcg_ctx, t1, tcg_ctx->mxu_gpr[XRc - 1], 0xFF << (8 * i));
            /* move the bytes to the leftmost position */
            tcg_gen_shli_i32(tcg_ctx, t0, t0, 8 * (3 - i));
            tcg_gen_shli_i32(tcg_ctx, t1, t1, 8 * (3 - i));
            /* t0 will be max/min of t0 and t1 */
            if (opc == OPC_MXU_Q8MAX) {
                tcg_gen_smax_i32(tcg_ctx, t0, t0, t1);
            } else {
                tcg_gen_smin_i32(tcg_ctx, t0, t0, t1);
            }
            /* return resulting byte to its original position */
            tcg_gen_shri_i32(tcg_ctx, t0, t0, 8 * (3 - i));
            /* finaly update the destination */
            tcg_gen_or_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], tcg_ctx->mxu_gpr[XRa - 1], t0);
        }

        tcg_temp_free(tcg_ctx, t1);
        tcg_temp_free(tcg_ctx, t0);
    }
}